

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

void nni_posix_udp_dosend(nni_plat_udp *udp)

{
  nni_aio *aio_00;
  nni_sockaddr *na;
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  uint local_174;
  undefined1 auStack_170 [4];
  uint i;
  msghdr hdr;
  iovec iov [8];
  nni_iov *aiov;
  uint niov;
  int cnt;
  int rv;
  int salen;
  sockaddr_storage ss;
  nni_list *q;
  nni_aio *aio;
  nni_plat_udp *udp_local;
  
  ss.__ss_align = (unsigned_long)&udp->udp_sendq;
  do {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)ss.__ss_align);
    if (aio_00 == (nni_aio *)0x0) {
      return;
    }
    niov = 0;
    aiov._4_4_ = 0;
    nni_aio_get_iov(aio_00,(uint *)&aiov,(nni_iov **)&iov[7].iov_len);
    if (8 < (uint)aiov) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                ,0xdd,"niov <= NNI_AIO_MAX_IOV");
    }
    na = (nni_sockaddr *)nni_aio_get_input(aio_00,0);
    sVar1 = nni_posix_nn2sockaddr(&rv,na);
    cnt = (int)sVar1;
    if (cnt < 1) {
      niov = 0xf;
    }
    else {
      memset(auStack_170,0,0x38);
      for (local_174 = 0; local_174 < (uint)aiov; local_174 = local_174 + 1) {
        iov[(ulong)local_174 - 1].iov_len = *(size_t *)(iov[7].iov_len + (ulong)local_174 * 0x10);
        iov[local_174].iov_base = *(void **)(iov[7].iov_len + (ulong)local_174 * 0x10 + 8);
      }
      hdr._8_8_ = &hdr.msg_flags;
      hdr.msg_iov = (iovec *)(ulong)(uint)aiov;
      _auStack_170 = &rv;
      hdr.msg_name._0_4_ = cnt;
      sVar2 = sendmsg(udp->udp_fd,(msghdr *)auStack_170,0x4000);
      aiov._4_4_ = (int)sVar2;
      if (aiov._4_4_ < 0) {
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        niov = nni_plat_errno(*piVar3);
      }
    }
    nni_list_remove((nni_list *)ss.__ss_align,aio_00);
    nni_aio_finish(aio_00,niov,(long)aiov._4_4_);
  } while( true );
}

Assistant:

static void
nni_posix_udp_dosend(nni_plat_udp *udp)
{
	nni_aio  *aio;
	nni_list *q = &udp->udp_sendq;

	// While we're able to send, do so.
	while ((aio = nni_list_first(q)) != NULL) {
		struct sockaddr_storage ss;

		int      salen;
		int      rv  = 0;
		int      cnt = 0;
		unsigned niov;
		nni_iov *aiov;

		nni_aio_get_iov(aio, &niov, &aiov);
		NNI_ASSERT(niov <= NNI_AIO_MAX_IOV);
		if ((salen = nni_posix_nn2sockaddr(
		         &ss, nni_aio_get_input(aio, 0))) < 1) {
			rv = NNG_EADDRINVAL;
		} else {
#ifdef NNG_HAVE_SENDMSG

			struct iovec  iov[NNI_AIO_MAX_IOV];
			struct msghdr hdr = { .msg_name = NULL };
			for (unsigned i = 0; i < niov; i++) {
				iov[i].iov_base = aiov[i].iov_buf;
				iov[i].iov_len  = aiov[i].iov_len;
			}
			hdr.msg_iov     = iov;
			hdr.msg_iovlen  = niov;
			hdr.msg_name    = &ss;
			hdr.msg_namelen = salen;

			cnt = sendmsg(udp->udp_fd, &hdr, MSG_NOSIGNAL);
			if (cnt < 0) {
				if ((errno == EAGAIN) ||
				    (errno == EWOULDBLOCK)) {
					// Cannot send now, leave.
					return;
				}
				rv = nni_plat_errno(errno);
			}
#else // !NNG_HAVE_SENDMSG
			uint8_t *buf;
			size_t   len;
			if (niov == 1) {
				buf = aiov[0].iov_buf;
				len = aiov[0].iov_len;
			} else {
				len = copy_to_bounce(aiov, niov);
				buf = bouncebuf;
			}
			cnt = sendto(
			    udp->udp_fd, buf, len, 0, (void *) &ss, salen);
			if (cnt < 0) {
				if ((errno == EAGAIN) ||
				    (errno == EWOULDBLOCK)) {
					// Cannot send now, leave.
					return;
				}
				rv = nni_plat_errno(errno);
			}
#endif
		}

		nni_list_remove(q, aio);
		nni_aio_finish(aio, rv, cnt);
	}
}